

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoConvert<double,unsigned_long>(Thread *this,Ptr *out_trap)

{
  undefined8 extraout_RDX;
  double dVar1;
  Value VVar2;
  
  VVar2 = Pop(this);
  dVar1 = wabt_convert_uint64_to_double(VVar2.i64_);
  VVar2._8_8_ = extraout_RDX;
  VVar2.f64_ = (f64)dVar1;
  Push(this,VVar2);
  return Ok;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}